

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iremga20.c
# Opt level: O2

UINT8 device_start_iremga20(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  DEV_DATA info;
  UINT8 UVar2;
  
  info.chipInf = calloc(1,0xc0);
  if ((DEV_DATA *)info.chipInf == (DEV_DATA *)0x0) {
    UVar2 = 0xff;
  }
  else {
    UVar2 = '\0';
    iremga20_set_mute_mask(info.chipInf,0);
    *(void **)info.chipInf = info.chipInf;
    uVar1 = cfg->clock;
    retDevInf->dataPtr = (DEV_DATA *)info.chipInf;
    retDevInf->sampleRate = uVar1 >> 2;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar2;
}

Assistant:

static UINT8 device_start_iremga20(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	ga20_state *chip;

	chip = (ga20_state *)calloc(1, sizeof(ga20_state));
	if (chip == NULL)
		return 0xFF;

	/* Initialize our chip structure */
	chip->rom = NULL;
	chip->rom_size = 0x00;
	chip->interpolate = 0;

	iremga20_set_mute_mask(chip, 0x0);

	chip->_devData.chipInf = chip;
	INIT_DEVINF(retDevInf, &chip->_devData, cfg->clock / 4, &devDef);

	return 0x00;
}